

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O1

CharString * __thiscall
icu_63::CharString::append(CharString *this,char *s,int32_t sLength,UErrorCode *errorCode)

{
  int iVar1;
  char *pcVar2;
  UBool UVar3;
  size_t sVar4;
  long lVar5;
  CharString CStack_68;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((sLength < -1) || (sLength != 0 && s == (char *)0x0)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (sLength < 0) {
        sVar4 = strlen(s);
        sLength = (int32_t)sVar4;
      }
      if (0 < sLength) {
        pcVar2 = (this->buffer).ptr;
        iVar1 = this->len;
        if (pcVar2 + iVar1 == s) {
          if (sLength < (this->buffer).capacity - iVar1) {
            this->len = sLength + iVar1;
            pcVar2[sLength + iVar1] = '\0';
          }
          else {
            *errorCode = U_INTERNAL_PROGRAM_ERROR;
          }
        }
        else if ((s < pcVar2 + iVar1 && pcVar2 <= s) && ((this->buffer).capacity - iVar1 <= sLength)
                ) {
          CharString(&CStack_68,s,sLength,errorCode);
          this = append(this,&CStack_68,errorCode);
          MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_68.buffer);
        }
        else {
          UVar3 = ensureCapacity(this,sLength + iVar1 + 1,0,errorCode);
          if (UVar3 != '\0') {
            memcpy((this->buffer).ptr + this->len,s,(ulong)(uint)sLength);
            lVar5 = (long)sLength + (long)this->len;
            this->len = (int32_t)lVar5;
            (this->buffer).ptr[lVar5] = '\0';
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CharString &CharString::append(const char *s, int32_t sLength, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(sLength<-1 || (s==NULL && sLength!=0)) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    if(sLength<0) {
        sLength= static_cast<int32_t>(uprv_strlen(s));
    }
    if(sLength>0) {
        if(s==(buffer.getAlias()+len)) {
            // The caller wrote into the getAppendBuffer().
            if(sLength>=(buffer.getCapacity()-len)) {
                // The caller wrote too much.
                errorCode=U_INTERNAL_PROGRAM_ERROR;
            } else {
                buffer[len+=sLength]=0;
            }
        } else if(buffer.getAlias()<=s && s<(buffer.getAlias()+len) &&
                  sLength>=(buffer.getCapacity()-len)
        ) {
            // (Part of) this string is appended to itself which requires reallocation,
            // so we have to make a copy of the substring and append that.
            return append(CharString(s, sLength, errorCode), errorCode);
        } else if(ensureCapacity(len+sLength+1, 0, errorCode)) {
            uprv_memcpy(buffer.getAlias()+len, s, sLength);
            buffer[len+=sLength]=0;
        }
    }
    return *this;
}